

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O1

void uc_init_ppc64(uc_struct_conflict10 *uc)

{
  uc->reg_read_ppc = reg_read_ppc64;
  uc->reg_write_ppc = reg_write_ppc64;
  uc->reg_reset = reg_reset;
  uc->release = ppc_release;
  uc->set_pc = ppc_set_pc;
  uc->get_pc = ppc_get_pc;
  uc->cpus_init = ppc_cpus_init;
  uc->cpu_context_size = 0x138a0;
  uc->write_mem = cpu_physical_mem_write;
  uc->read_mem = cpu_physical_mem_read;
  uc->tcg_exec_init_ppc = tcg_exec_init_ppc64;
  uc->cpu_exec_init_all_ppc = cpu_exec_init_all_ppc64;
  uc->vm_start_ppc = vm_start_ppc64;
  uc->memory_map_ppc = memory_map_ppc64;
  uc->memory_map_ptr_ppc = memory_map_ptr_ppc64;
  uc->memory_unmap_ppc = memory_unmap_ppc64;
  uc->memory_moveout_ppc = memory_moveout_ppc64;
  uc->memory_movein_ppc = memory_movein_ppc64;
  uc->readonly_mem = memory_region_set_readonly_ppc64;
  uc->target_page = target_page_init;
  uc->softfloat_initialize = softfloat_init_ppc64;
  uc->tcg_flush_tlb = tcg_flush_softmmu_tlb_ppc64;
  uc->memory_map_io_ppc = memory_map_io_ppc64;
  uc->set_tlb = uc_set_tlb;
  uc->memory_mapping = find_memory_mapping_ppc64;
  uc->memory_filter_subregions = memory_region_filter_subregions_ppc64;
  uc->memory_cow_ppc = memory_cow_ppc64;
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->release = ppc_release;
    uc->set_pc = ppc_set_pc;
    uc->get_pc = ppc_get_pc;
    uc->cpus_init = ppc_cpus_init;
    uc->cpu_context_size = offsetof(CPUPPCState, uc);
    uc_common_init(uc);
}